

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void * alGetProcAddress(ALchar *funcname)

{
  int iVar1;
  code *local_18;
  void *retval;
  ALchar *funcname_local;
  
  local_18 = (code *)0x0;
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetProcAddress);
  IO_STRING(funcname);
  if ((((funcname == (ALchar *)0x0) || (*funcname != 'a')) || (funcname[1] != 'l')) ||
     (funcname[2] == 'c')) {
    local_18 = (code *)0x0;
  }
  else {
    iVar1 = strcmp(funcname,"alcGetCurrentContext");
    if (iVar1 == 0) {
      local_18 = alcGetCurrentContext;
    }
    else {
      iVar1 = strcmp(funcname,"alcGetContextsDevice");
      if (iVar1 == 0) {
        local_18 = alcGetContextsDevice;
      }
      else {
        iVar1 = strcmp(funcname,"alcIsExtensionPresent");
        if (iVar1 == 0) {
          local_18 = alcIsExtensionPresent;
        }
        else {
          iVar1 = strcmp(funcname,"alcGetProcAddress");
          if (iVar1 == 0) {
            local_18 = alcGetProcAddress;
          }
          else {
            iVar1 = strcmp(funcname,"alcGetEnumValue");
            if (iVar1 == 0) {
              local_18 = alcGetEnumValue;
            }
            else {
              iVar1 = strcmp(funcname,"alcGetString");
              if (iVar1 == 0) {
                local_18 = alcGetString;
              }
              else {
                iVar1 = strcmp(funcname,"alcCaptureOpenDevice");
                if (iVar1 == 0) {
                  local_18 = alcCaptureOpenDevice;
                }
                else {
                  iVar1 = strcmp(funcname,"alcCaptureCloseDevice");
                  if (iVar1 == 0) {
                    local_18 = alcCaptureCloseDevice;
                  }
                  else {
                    iVar1 = strcmp(funcname,"alcOpenDevice");
                    if (iVar1 == 0) {
                      local_18 = alcOpenDevice;
                    }
                    else {
                      iVar1 = strcmp(funcname,"alcCloseDevice");
                      if (iVar1 == 0) {
                        local_18 = alcCloseDevice;
                      }
                      else {
                        iVar1 = strcmp(funcname,"alcCreateContext");
                        if (iVar1 == 0) {
                          local_18 = alcCreateContext;
                        }
                        else {
                          iVar1 = strcmp(funcname,"alcMakeContextCurrent");
                          if (iVar1 == 0) {
                            local_18 = alcMakeContextCurrent;
                          }
                          else {
                            iVar1 = strcmp(funcname,"alcProcessContext");
                            if (iVar1 == 0) {
                              local_18 = alcProcessContext;
                            }
                            else {
                              iVar1 = strcmp(funcname,"alcSuspendContext");
                              if (iVar1 == 0) {
                                local_18 = alcSuspendContext;
                              }
                              else {
                                iVar1 = strcmp(funcname,"alcDestroyContext");
                                if (iVar1 == 0) {
                                  local_18 = alcDestroyContext;
                                }
                                else {
                                  iVar1 = strcmp(funcname,"alcGetError");
                                  if (iVar1 == 0) {
                                    local_18 = alcGetError;
                                  }
                                  else {
                                    iVar1 = strcmp(funcname,"alcGetIntegerv");
                                    if (iVar1 == 0) {
                                      local_18 = alcGetIntegerv;
                                    }
                                    else {
                                      iVar1 = strcmp(funcname,"alcCaptureStart");
                                      if (iVar1 == 0) {
                                        local_18 = alcCaptureStart;
                                      }
                                      else {
                                        iVar1 = strcmp(funcname,"alcCaptureStop");
                                        if (iVar1 == 0) {
                                          local_18 = alcCaptureStop;
                                        }
                                        else {
                                          iVar1 = strcmp(funcname,"alcCaptureSamples");
                                          if (iVar1 == 0) {
                                            local_18 = alcCaptureSamples;
                                          }
                                          else {
                                            iVar1 = strcmp(funcname,"alDopplerFactor");
                                            if (iVar1 == 0) {
                                              local_18 = alDopplerFactor;
                                            }
                                            else {
                                              iVar1 = strcmp(funcname,"alDopplerVelocity");
                                              if (iVar1 == 0) {
                                                local_18 = alDopplerVelocity;
                                              }
                                              else {
                                                iVar1 = strcmp(funcname,"alSpeedOfSound");
                                                if (iVar1 == 0) {
                                                  local_18 = alSpeedOfSound;
                                                }
                                                else {
                                                  iVar1 = strcmp(funcname,"alDistanceModel");
                                                  if (iVar1 == 0) {
                                                    local_18 = alDistanceModel;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alEnable");
                                                    if (iVar1 == 0) {
                                                      local_18 = alEnable;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alDisable");
                                                      if (iVar1 == 0) {
                                                        local_18 = alDisable;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alIsEnabled");
                                                        if (iVar1 == 0) {
                                                          local_18 = alIsEnabled;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetString");
                                                          if (iVar1 == 0) {
                                                            local_18 = alGetString;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alGetBooleanv")
                                                            ;
                                                            if (iVar1 == 0) {
                                                              local_18 = alGetBooleanv;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,
                                                  "alGetIntegerv");
                                                  if (iVar1 == 0) {
                                                    local_18 = alGetIntegerv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetFloatv");
                                                    if (iVar1 == 0) {
                                                      local_18 = alGetFloatv;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alGetDoublev");
                                                      if (iVar1 == 0) {
                                                        local_18 = alGetDoublev;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetBoolean");
                                                        if (iVar1 == 0) {
                                                          local_18 = alGetBoolean;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetInteger");
                                                          if (iVar1 == 0) {
                                                            local_18 = alGetInteger;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alGetFloat");
                                                            if (iVar1 == 0) {
                                                              local_18 = alGetFloat;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alGetDouble")
                                                              ;
                                                              if (iVar1 == 0) {
                                                                local_18 = alGetDouble;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,
                                                  "alIsExtensionPresent");
                                                  if (iVar1 == 0) {
                                                    local_18 = alIsExtensionPresent;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetError");
                                                    if (iVar1 == 0) {
                                                      local_18 = alGetError;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alGetProcAddress");
                                                      if (iVar1 == 0) {
                                                        local_18 = alGetProcAddress;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetEnumValue");
                                                        if (iVar1 == 0) {
                                                          local_18 = alGetEnumValue;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alListenerfv");
                                                          if (iVar1 == 0) {
                                                            local_18 = alListenerfv;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alListenerf");
                                                            if (iVar1 == 0) {
                                                              local_18 = alListenerf;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alListener3f"
                                                                            );
                                                              if (iVar1 == 0) {
                                                                local_18 = alListener3f;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,
                                                  "alListeneriv");
                                                  if (iVar1 == 0) {
                                                    local_18 = alListeneriv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alListeneri");
                                                    if (iVar1 == 0) {
                                                      local_18 = alListeneri;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alListener3i");
                                                      if (iVar1 == 0) {
                                                        local_18 = alListener3i;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetListenerfv");
                                                        if (iVar1 == 0) {
                                                          local_18 = alGetListenerfv;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetListenerf");
                                                          if (iVar1 == 0) {
                                                            local_18 = alGetListenerf;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,
                                                  "alGetListener3f");
                                                  if (iVar1 == 0) {
                                                    local_18 = alGetListener3f;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetListeneri");
                                                    if (iVar1 == 0) {
                                                      local_18 = alGetListeneri;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alGetListeneriv");
                                                      if (iVar1 == 0) {
                                                        local_18 = alGetListeneriv;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetListener3i");
                                                        if (iVar1 == 0) {
                                                          local_18 = alGetListener3i;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGenSources");
                                                          if (iVar1 == 0) {
                                                            local_18 = alGenSources;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,
                                                  "alDeleteSources");
                                                  if (iVar1 == 0) {
                                                    local_18 = alDeleteSources;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alIsSource");
                                                    if (iVar1 == 0) {
                                                      local_18 = alIsSource;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alSourcefv");
                                                      if (iVar1 == 0) {
                                                        local_18 = alSourcefv;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alSourcef");
                                                        if (iVar1 == 0) {
                                                          local_18 = alSourcef;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alSource3f");
                                                          if (iVar1 == 0) {
                                                            local_18 = alSource3f;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alSourceiv");
                                                            if (iVar1 == 0) {
                                                              local_18 = alSourceiv;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alSourcei");
                                                              if (iVar1 == 0) {
                                                                local_18 = alSourcei;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,"alSource3i"
                                                                              );
                                                                if (iVar1 == 0) {
                                                                  local_18 = alSource3i;
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(funcname,
                                                  "alGetSourcefv");
                                                  if (iVar1 == 0) {
                                                    local_18 = alGetSourcefv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetSourcef");
                                                    if (iVar1 == 0) {
                                                      local_18 = alGetSourcef;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alGetSource3f");
                                                      if (iVar1 == 0) {
                                                        local_18 = alGetSource3f;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetSourceiv");
                                                        if (iVar1 == 0) {
                                                          local_18 = alGetSourceiv;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetSourcei");
                                                          if (iVar1 == 0) {
                                                            local_18 = alGetSourcei;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alGetSource3i")
                                                            ;
                                                            if (iVar1 == 0) {
                                                              local_18 = alGetSource3i;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alSourcePlay"
                                                                            );
                                                              if (iVar1 == 0) {
                                                                local_18 = alSourcePlay;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,
                                                  "alSourcePlayv");
                                                  if (iVar1 == 0) {
                                                    local_18 = alSourcePlayv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alSourcePause");
                                                    if (iVar1 == 0) {
                                                      local_18 = alSourcePause;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alSourcePausev");
                                                      if (iVar1 == 0) {
                                                        local_18 = alSourcePausev;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alSourceRewind");
                                                        if (iVar1 == 0) {
                                                          local_18 = alSourceRewind;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alSourceRewindv")
                                                          ;
                                                          if (iVar1 == 0) {
                                                            local_18 = alSourceRewindv;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alSourceStop");
                                                            if (iVar1 == 0) {
                                                              local_18 = alSourceStop;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,
                                                  "alSourceStopv");
                                                  if (iVar1 == 0) {
                                                    local_18 = alSourceStopv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alSourceQueueBuffers");
                                                    if (iVar1 == 0) {
                                                      local_18 = alSourceQueueBuffers;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,
                                                  "alSourceUnqueueBuffers");
                                                  if (iVar1 == 0) {
                                                    local_18 = alSourceUnqueueBuffers;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGenBuffers");
                                                    if (iVar1 == 0) {
                                                      local_18 = alGenBuffers;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alDeleteBuffers");
                                                      if (iVar1 == 0) {
                                                        local_18 = alDeleteBuffers;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alIsBuffer");
                                                        if (iVar1 == 0) {
                                                          local_18 = alIsBuffer;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alBufferData");
                                                          if (iVar1 == 0) {
                                                            local_18 = alBufferData;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alBufferfv");
                                                            if (iVar1 == 0) {
                                                              local_18 = alBufferfv;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alBufferf");
                                                              if (iVar1 == 0) {
                                                                local_18 = alBufferf;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,"alBuffer3f"
                                                                              );
                                                                if (iVar1 == 0) {
                                                                  local_18 = alBuffer3f;
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(funcname,
                                                  "alBufferiv");
                                                  if (iVar1 == 0) {
                                                    local_18 = alBufferiv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alBufferi");
                                                    if (iVar1 == 0) {
                                                      local_18 = alBufferi;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alBuffer3i");
                                                      if (iVar1 == 0) {
                                                        local_18 = alBuffer3i;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetBufferfv");
                                                        if (iVar1 == 0) {
                                                          local_18 = alGetBufferfv;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetBufferf");
                                                          if (iVar1 == 0) {
                                                            local_18 = alGetBufferf;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alGetBuffer3f")
                                                            ;
                                                            if (iVar1 == 0) {
                                                              local_18 = alGetBuffer3f;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alGetBufferi"
                                                                            );
                                                              if (iVar1 == 0) {
                                                                local_18 = alGetBufferi;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,
                                                  "alGetBuffer3i");
                                                  if (iVar1 == 0) {
                                                    local_18 = alGetBuffer3i;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetBufferiv");
                                                    if (iVar1 == 0) {
                                                      local_18 = alGetBufferiv;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alTracePushScope");
                                                      if (iVar1 == 0) {
                                                        local_18 = alTracePushScope;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alTracePopScope");
                                                        if (iVar1 == 0) {
                                                          local_18 = alTracePopScope;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alTraceMessage");
                                                          if (iVar1 == 0) {
                                                            local_18 = alTraceMessage;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,
                                                  "alTraceBufferLabel");
                                                  if (iVar1 == 0) {
                                                    local_18 = alTraceBufferLabel;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alTraceSourceLabel");
                                                    if (iVar1 == 0) {
                                                      local_18 = alTraceSourceLabel;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alcTraceDeviceLabel")
                                                      ;
                                                      if (iVar1 == 0) {
                                                        local_18 = alcTraceDeviceLabel;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,
                                                  "alcTraceContextLabel");
                                                  if (iVar1 == 0) {
                                                    local_18 = alcTraceContextLabel;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  IO_PTR(local_18);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return local_18;
}

Assistant:

void *alGetProcAddress(const ALchar *funcname)
{
    void *retval = NULL;
    IO_START(alGetProcAddress);
    IO_STRING(funcname);

    // always return our entry points, so the app always calls through here.
    if (!funcname || ((funcname[0] != 'a') || (funcname[1] != 'l') || (funcname[2] == 'c'))) {
        // !!! FIXME: should set an error state.
        retval = NULL;
    }
    #define ENTRYPOINT(ret,fn,params,args,numargs,visitparams,visitargs) else if (strcmp(funcname, #fn) == 0) { retval = (void *) fn; }
    #include "altrace_entrypoints.h"

    IO_PTR(retval);
    IO_END();
    return retval;
}